

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.cpp
# Opt level: O2

void ht_resize(ht_hash_table *ht,int base_size)

{
  int iVar1;
  ht_item *phVar2;
  ht_item **pphVar3;
  int iVar4;
  ht_hash_table *ht_00;
  int i;
  long lVar5;
  
  if (base_size < 0x28) {
    return;
  }
  ht_00 = ht_new_sized(base_size);
  for (lVar5 = 0; iVar1 = ht->size, lVar5 < iVar1; lVar5 = lVar5 + 1) {
    phVar2 = ht->items[lVar5];
    if (phVar2 != &HT_DELETED_ITEM && phVar2 != (ht_item *)0x0) {
      ht_insert(ht_00,phVar2->key,phVar2->value);
    }
  }
  ht->count = ht_00->count;
  iVar4 = ht_00->size;
  ht->base_size = ht_00->base_size;
  ht->size = iVar4;
  ht_00->size = iVar1;
  pphVar3 = ht->items;
  ht->items = ht_00->items;
  ht_00->items = pphVar3;
  ht_del_hash_table(ht_00);
  return;
}

Assistant:

static void ht_resize(ht_hash_table* ht, const int base_size) {
    if (base_size < HT_INITIAL_BASE_SIZE) {
        return;
    }

    ht_hash_table* new_ht = ht_new_sized(base_size);
    for (int i = 0; i < ht->size; i++) {
        ht_item* item = ht->items[i];
        if (item != nullptr && item != &HT_DELETED_ITEM) {
            ht_insert(new_ht, item->key, item->value);
        }
    }

    ht->base_size = new_ht->base_size;
    ht->count = new_ht->count;

    const int tmp_size = ht->size;
    ht->size = new_ht->size;
    new_ht->size = tmp_size;

    ht_item** tmp_items = ht->items;
    ht->items = new_ht->items;
    new_ht->items = tmp_items;
    ht_del_hash_table(new_ht);
}